

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

vector<duckdb::ColumnSegmentInfo,_true> * __thiscall
duckdb::RowGroupCollection::GetColumnSegmentInfo
          (vector<duckdb::ColumnSegmentInfo,_true> *__return_storage_ptr__,RowGroupCollection *this)

{
  SegmentIterator __begin1;
  SegmentIterator local_28;
  SegmentIterationHelper local_18;
  
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>).
  super__Vector_base<duckdb::ColumnSegmentInfo,_std::allocator<duckdb::ColumnSegmentInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups)->
        super_SegmentTree<duckdb::RowGroup,_true>;
  local_28 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_18);
  while (local_28.current != (RowGroup *)0x0) {
    RowGroup::GetColumnSegmentInfo
              (local_28.current,((local_28.current)->super_SegmentBase<duckdb::RowGroup>).index,
               __return_storage_ptr__);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnSegmentInfo> RowGroupCollection::GetColumnSegmentInfo() {
	vector<ColumnSegmentInfo> result;
	for (auto &row_group : row_groups->Segments()) {
		row_group.GetColumnSegmentInfo(row_group.index, result);
	}
	return result;
}